

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * matchbalance(MatchState *ms,char *s,char *p)

{
  char *pcVar1;
  int local_34;
  int cont;
  int e;
  int b;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  if ((*p != '\0') && (p[1] != '\0')) {
    if (*s == *p) {
      local_34 = 1;
      pcVar1 = s;
      do {
        while( true ) {
          p_local = pcVar1;
          pcVar1 = p_local + 1;
          if (ms->src_end <= pcVar1) {
            return (char *)0x0;
          }
          if (*pcVar1 == p[1]) break;
          if (*pcVar1 == *p) {
            local_34 = local_34 + 1;
          }
        }
        local_34 = local_34 + -1;
      } while (local_34 != 0);
      ms_local = (MatchState *)(p_local + 2);
    }
    else {
      ms_local = (MatchState *)0x0;
    }
    return (char *)ms_local;
  }
  lj_err_caller(ms->L,LJ_ERR_STRPATU);
}

Assistant:

static const char *matchbalance(MatchState *ms, const char *s, const char *p)
{
  if (*p == 0 || *(p+1) == 0)
    lj_err_caller(ms->L, LJ_ERR_STRPATU);
  if (*s != *p) {
    return NULL;
  } else {
    int b = *p;
    int e = *(p+1);
    int cont = 1;
    while (++s < ms->src_end) {
      if (*s == e) {
	if (--cont == 0) return s+1;
      } else if (*s == b) {
	cont++;
      }
    }
  }
  return NULL;  /* string ends out of balance */
}